

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

void IO_STRING(char *str)

{
  size_t x;
  size_t sVar1;
  
  if (str == (char *)0x0) {
    IO_UINT64(0xffffffffffffffff);
    return;
  }
  x = strlen(str);
  IO_UINT64(x);
  if (x != 0) {
    sVar1 = write(logfd,str,x);
    if (sVar1 != x) {
      IO_WRITE_FAIL();
    }
  }
  return;
}

Assistant:

static void IO_STRING(const char *str)
{
    if (!str) {
        IO_UINT64(0xFFFFFFFFFFFFFFFFull);
    } else {
        const size_t len = strlen(str);
        IO_UINT64((uint64) len);
        if (len > 0) {
            if (write(logfd, str, len) != len) IO_WRITE_FAIL();
        }
    }
}